

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O2

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseNull<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  char *pcVar1;
  char *pcVar2;
  Ch *pCVar3;
  bool bVar4;
  MemoryStream *pMVar5;
  char *pcVar6;
  undefined4 uVar7;
  char *pcVar8;
  
  pMVar5 = is->is_;
  pcVar8 = pMVar5->src_;
  pcVar2 = pMVar5->end_;
  if (pcVar8 != pcVar2) {
    pcVar8 = pcVar8 + 1;
    pMVar5->src_ = pcVar8;
  }
  uVar7 = 3;
  pcVar6 = pcVar2;
  if ((pcVar8 != pcVar2) && (pcVar6 = pcVar8, *pcVar8 == 'u')) {
    pcVar1 = pcVar8 + 1;
    pMVar5->src_ = pcVar1;
    pcVar6 = pcVar2;
    if ((pcVar1 != pcVar2) && (pcVar6 = pcVar1, *pcVar1 == 'l')) {
      pcVar1 = pcVar8 + 2;
      pMVar5->src_ = pcVar1;
      pcVar6 = pcVar2;
      if ((pcVar1 != pcVar2) && (pcVar6 = pcVar1, *pcVar1 == 'l')) {
        pMVar5->src_ = pcVar8 + 3;
        bVar4 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::Null(handler);
        if (bVar4) {
          return;
        }
        pMVar5 = is->is_;
        uVar7 = 0x10;
        pcVar6 = pMVar5->src_;
      }
    }
  }
  pCVar3 = pMVar5->begin_;
  *(undefined4 *)(this + 0x30) = uVar7;
  *(long *)(this + 0x38) = (long)pcVar6 - (long)pCVar3;
  return;
}

Assistant:

void ParseNull(InputStream& is, Handler& handler) {
        RAPIDJSON_ASSERT(is.Peek() == 'n');
        is.Take();

        if (RAPIDJSON_LIKELY(Consume(is, 'u') && Consume(is, 'l') && Consume(is, 'l'))) {
            if (RAPIDJSON_UNLIKELY(!handler.Null()))
                RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
        }
        else
            RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, is.Tell());
    }